

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  byte *first;
  int iVar1;
  contenc_writer *pcVar2;
  bool bVar3;
  contenc_writer *writer;
  content_encoding *encoding;
  size_t namelen;
  char *name;
  SingleRequest *k;
  byte *pbStack_20;
  int maybechunked_local;
  char *enclist_local;
  Curl_easy *data_local;
  
  pbStack_20 = (byte *)enclist;
  do {
    while( true ) {
      first = pbStack_20;
      iVar1 = Curl_isspace((uint)*pbStack_20);
      bVar3 = true;
      if (iVar1 == 0) {
        bVar3 = *pbStack_20 == 0x2c;
      }
      if (!bVar3) break;
      pbStack_20 = pbStack_20 + 1;
    }
    encoding = (content_encoding *)0x0;
    while( true ) {
      bVar3 = false;
      if (*pbStack_20 != 0) {
        bVar3 = *pbStack_20 != 0x2c;
      }
      if (!bVar3) break;
      iVar1 = Curl_isspace((uint)*pbStack_20);
      if (iVar1 == 0) {
        encoding = (content_encoding *)(pbStack_20 + (1 - (long)first));
      }
      pbStack_20 = pbStack_20 + 1;
    }
    if (((maybechunked == 0) || (encoding != (content_encoding *)0x7)) ||
       (iVar1 = Curl_strncasecompare((char *)first,"chunked",7), iVar1 == 0)) {
      if (encoding != (content_encoding *)0x0) {
        writer = (contenc_writer *)find_encoding((char *)first,(size_t)encoding);
        if ((data->req).writer_stack == (contenc_writer *)0x0) {
          pcVar2 = new_unencoding_writer(data,&client_encoding,(contenc_writer *)0x0);
          (data->req).writer_stack = pcVar2;
          if ((data->req).writer_stack == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if ((content_encoding *)writer == (content_encoding *)0x0) {
          writer = (contenc_writer *)&error_encoding;
        }
        pcVar2 = new_unencoding_writer(data,(content_encoding *)writer,(data->req).writer_stack);
        if (pcVar2 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->req).writer_stack = pcVar2;
      }
    }
    else {
      *(ushort *)&(data->req).field_0xd8 = *(ushort *)&(data->req).field_0xd8 & 0xffdf | 0x20;
      Curl_httpchunk_init(data);
    }
    if (*pbStack_20 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}